

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arun.cpp
# Opt level: O3

rotation_t * opengv::math::arun(rotation_t *__return_storage_ptr__,MatrixXd *Hcross)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double *pdVar12;
  long lVar13;
  double *pdVar14;
  ActualDstType actualDst;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Matrix3d U;
  type tmp;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVDcross;
  double local_2f8 [8];
  double local_2b8 [2];
  double local_2a8 [4];
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_230;
  
  pdVar14 = local_2f8;
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD(&local_230,Hcross,0x14);
  dVar8 = local_230.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
          m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[2];
  dVar9 = *local_230.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  dVar10 = local_230.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data[1];
  local_258 = dVar8;
  dStack_250 = local_230.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data[3];
  local_248 = local_230.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_230.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows + 1];
  dVar1 = local_230.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
          m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows + 2];
  dStack_240 = (local_230.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data +
               local_230.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows + 1)[1];
  auVar15 = *(undefined1 (*) [16])
             (local_230.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data + local_230.
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                       .m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows * 2);
  dVar2 = local_230.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
          m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 2 + 2];
  pdVar12 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + 2;
  local_2f8[0] = *local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
  local_2f8[1] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[1];
  local_2f8[2] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[2];
  local_2f8[3] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[3];
  local_2f8[4] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows + 1];
  local_2f8[5] = (local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows + 1)[1];
  local_2f8[6] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 2];
  local_2f8[7] = (local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 2)[1];
  lVar13 = 0;
  local_2b8[0] = local_230.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_230.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 2 + 2];
  auVar11._8_8_ = local_248;
  auVar11._0_8_ =
       local_230.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       [3];
  do {
    dVar3 = local_2f8[lVar13];
    dVar4 = local_2f8[lVar13 + 3];
    auVar21._8_8_ = dVar4;
    auVar21._0_8_ = dVar4;
    dVar5 = local_2f8[lVar13 + 6];
    auVar24._8_8_ = dVar5;
    auVar24._0_8_ = dVar5;
    lVar13 = lVar13 + 1;
    auVar18._0_8_ = dVar9 * dVar3;
    auVar18._8_8_ = dVar10 * dVar3;
    auVar18 = vfmadd231pd_fma(auVar18,auVar11,auVar21);
    auVar18 = vfmadd231pd_fma(auVar18,auVar15,auVar24);
    *(undefined1 (*) [16])((plain_array<double,_9,_0,_0> *)(pdVar12 + -2))->array = auVar18;
    *pdVar12 = dVar3 * dVar8 + dVar5 * dVar2 + dVar4 * dVar1;
    pdVar12 = pdVar12 + 3;
  } while (lVar13 != 3);
  dVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[7];
  dVar4 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[5];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar4;
  dVar5 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[2];
  dVar6 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[4];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar6;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[8];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[1];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar4 * dVar3;
  auVar18 = vfmsub231sd_fma(auVar27,auVar16,auVar19);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar5 * dVar3;
  auVar21 = vfmsub231sd_fma(auVar22,auVar28,auVar19);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar5 * dVar6;
  auVar24 = vfmsub231sd_fma(auVar17,auVar28,auVar25);
  if (auVar24._0_8_ *
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[6] +
      (auVar18._0_8_ *
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[0] -
      auVar21._0_8_ *
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[3]) < 0.0) {
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar15 = vxorpd_avx512vl(auVar15,auVar7);
    lVar13 = 2;
    do {
      dVar3 = *pdVar14;
      dVar4 = pdVar14[3];
      auVar23._8_8_ = dVar4;
      auVar23._0_8_ = dVar4;
      dVar5 = pdVar14[6];
      auVar26._8_8_ = dVar5;
      auVar26._0_8_ = dVar5;
      pdVar14 = pdVar14 + 1;
      auVar20._0_8_ = dVar9 * dVar3;
      auVar20._8_8_ = dVar10 * dVar3;
      auVar18 = vfmadd231pd_fma(auVar20,auVar11,auVar23);
      auVar18 = vfmadd231pd_fma(auVar18,auVar15,auVar26);
      *(undefined1 (*) [16])(local_2b8 + lVar13) = auVar18;
      local_2a8[lVar13] = dVar8 * dVar3 + (dVar4 * dVar1 - dVar5 * dVar2);
      lVar13 = lVar13 + 3;
    } while (lVar13 != 0xb);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[0] = local_2a8[0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[1] = local_2a8[1];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[2] = local_2a8[2];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[3] = local_2a8[3];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[4] = local_288;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[5] = dStack_280;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[6] = local_278;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[7] = dStack_270;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
    .m_data.array[8] = local_268;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_230);
  return __return_storage_ptr__;
}

Assistant:

opengv::rotation_t
opengv::math::arun( const Eigen::MatrixXd & Hcross )
{
  //decompose matrix H to obtain rotation
  Eigen::JacobiSVD< Eigen::MatrixXd > SVDcross(
      Hcross,
      Eigen::ComputeFullU | Eigen::ComputeFullV );

  Eigen::Matrix3d V = SVDcross.matrixV();
  Eigen::Matrix3d U = SVDcross.matrixU();
  rotation_t R = V * U.transpose();

  //modify the result in case the rotation has determinant=-1
  if( R.determinant() < 0 )
  {
    Eigen::Matrix3d V_prime;
    V_prime.col(0) = V.col(0);
    V_prime.col(1) = V.col(1);
    V_prime.col(2) = -V.col(2);
    R = V_prime * U.transpose();
  }

  return R;
}